

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::exceptionsCatchAfter(Forth *this)

{
  uint uVar1;
  Forth *this_local;
  
  uVar1 = ForthStack<unsigned_int>::getTop(&this->catchStack);
  this->exceptionHandler = uVar1;
  ForthStack<unsigned_int>::pop(&this->catchStack);
  ForthStack<unsigned_int>::pop(&this->catchStack);
  ForthStack<unsigned_int>::pop(&this->catchStack);
  ForthStack<unsigned_int>::pop(&this->catchStack);
  ForthStack<unsigned_int>::pop(&this->catchStack);
  ForthStack<unsigned_int>::push(&this->dStack,0);
  return;
}

Assistant:

void exceptionsCatchAfter(){
			exceptionHandler = catchStack.getTop(); catchStack.pop();
			catchStack.pop();
			catchStack.pop();
			catchStack.pop();
			catchStack.pop();
			dStack.push(0);
		}